

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBoxHeader(char *label,ImVec2 *size_arg)

{
  bool bVar1;
  ImVec2 *in_RSI;
  float fVar2;
  float _y;
  ImRect bb;
  ImRect frame_bb;
  ImVec2 frame_size;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  float local_d4;
  float in_stack_ffffffffffffff34;
  ImVec2 in_stack_ffffffffffffff38;
  ImRect *nav_bb_arg;
  char *in_stack_ffffffffffffff40;
  ImVec2 *min;
  ImGuiID id_00;
  char *in_stack_ffffffffffffff48;
  ImRect *bb_00;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 hide_text_after_hash;
  ImVec2 in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  ImVec2 in_stack_ffffffffffffff70;
  ImVec2 local_88;
  ImRect local_80;
  ImVec2 local_70;
  ImRect local_68;
  ImRect local_58;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImGuiID local_34;
  ImGuiStyle *local_30;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  ImVec2 *local_18;
  bool local_1;
  
  hide_text_after_hash = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  local_20 = GImGui;
  local_18 = in_RSI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = &local_20->Style;
    local_34 = GetID(in_stack_ffffffffffffff20);
    local_3c = CalcTextSize(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            in_stack_ffffffffffffff38.y._3_1_,in_stack_ffffffffffffff38.x);
    local_58.Max = *local_18;
    fVar2 = CalcItemWidth();
    GetTextLineHeightWithSpacing();
    local_44 = CalcItemSize(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,fVar2);
    fVar2 = local_44.x;
    _y = ImMax<float>(local_44.y,local_3c.y);
    nav_bb_arg = &local_58;
    ImVec2::ImVec2(&nav_bb_arg->Min,fVar2,_y);
    min = &(local_28->DC).CursorPos;
    local_70 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (ImVec2 *)0x1d8684);
    ImRect::ImRect(&local_68,min,&local_70);
    bb_00 = &local_68;
    if (local_3c.x <= 0.0) {
      local_d4 = 0.0;
    }
    else {
      local_d4 = (local_30->ItemInnerSpacing).x + local_3c.x;
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff70,local_d4,0.0);
    local_88 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                         (ImVec2 *)0x1d8720);
    ImRect::ImRect(&local_80,&bb_00->Min,&local_88);
    (local_28->DC).LastItemRect.Min = local_80.Min;
    (local_28->DC).LastItemRect.Max = local_80.Max;
    ImGuiNextItemData::ClearFlags(&local_20->NextItemData);
    bVar1 = IsRectVisible(min,&nav_bb_arg->Min);
    if (bVar1) {
      BeginGroup();
      id_00 = (ImGuiID)((ulong)min >> 0x20);
      if (0.0 < local_3c.x) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,
                       local_68.Max.x + (local_30->ItemInnerSpacing).x,
                       local_68.Min.y + (local_30->FramePadding).y);
        RenderText(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (char *)in_stack_ffffffffffffff60,(bool)hide_text_after_hash);
      }
      ImRect::GetSize((ImRect *)CONCAT44(local_34,in_stack_ffffffffffffff18));
      BeginChildFrame(id_00,&nav_bb_arg->Min,(ImGuiWindowFlags)fVar2);
      local_1 = true;
    }
    else {
      ImRect::GetSize((ImRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      ItemSize(min,(float)((ulong)nav_bb_arg >> 0x20));
      ItemAdd(bb_00,(ImGuiID)((ulong)min >> 0x20),nav_bb_arg);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7 items. Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.4f + style.ItemSpacing.y);
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    window->DC.LastItemRect = bb; // Forward storage for ListBoxFooter.. dodgy.
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    BeginGroup();
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}